

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::Image::ImageFormatCase::iterate(ImageFormatCase *this)

{
  int iVar1;
  uint uVar2;
  const_reference pvVar3;
  reference ppIVar4;
  size_type sVar5;
  bool isOk;
  ImageApi *api;
  Operation *op;
  ImageFormatCase *this_local;
  
  iVar1 = this->m_curIter;
  this->m_curIter = iVar1 + 1;
  pvVar3 = std::
           vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
           ::operator[](&(this->m_spec).operations,(long)iVar1);
  ppIVar4 = std::vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
            ::operator[](&this->m_apiContexts,(long)pvVar3->apiIndex);
  uVar2 = (*pvVar3->action->_vptr_Action[2])(pvVar3->action,*ppIVar4,&this->m_img,&this->m_refImg);
  if (((uVar2 & 1) != 0) &&
     (iVar1 = this->m_curIter,
     sVar5 = std::
             vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
             ::size(&(this->m_spec).operations), iVar1 < (int)sVar5)) {
    return CONTINUE;
  }
  if ((uVar2 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

TestCase::IterateResult ImageFormatCase::iterate (void)
{
	const TestSpec::Operation&	op		= m_spec.operations[m_curIter++];
	ImageApi&					api		= *m_apiContexts[op.apiIndex];
	const bool					isOk	= op.action->invoke(api, m_img, m_refImg);

	if (isOk && m_curIter < (int)m_spec.operations.size())
		return CONTINUE;
	else if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}